

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O0

int __thiscall soplex::SPxDantzigPR<double>::selectLeaveSparse(SPxDantzigPR<double> *this)

{
  pointer pdVar1;
  double dVar2;
  char *pcVar3;
  double *pdVar4;
  int *piVar5;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  VectorBase<double> *in_RDI;
  int i;
  int index;
  int n;
  double x;
  double best;
  int in_stack_ffffffffffffffcc;
  uint local_24;
  int local_1c;
  double local_10;
  
  pdVar1 = in_RDI[1].val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1c = -1;
  local_24 = IdxSet::size((IdxSet *)
                          ((in_RDI->val).super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 0xfd));
  uVar6 = extraout_RDX;
  local_10 = -(double)pdVar1;
  while (local_24 = local_24 - 1, -1 < (int)local_24) {
    pcVar3 = IdxSet::index((IdxSet *)
                           ((in_RDI->val).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 0xfd),
                           (char *)(ulong)local_24,(int)uVar6);
    SPxSolverBase<double>::fTest
              ((SPxSolverBase<double> *)
               (in_RDI->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    pdVar4 = VectorBase<double>::operator[](in_RDI,in_stack_ffffffffffffffcc);
    dVar2 = *pdVar4;
    if (-(double)in_RDI[1].val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start <= dVar2) {
      IdxSet::remove((IdxSet *)
                     ((in_RDI->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 0xfd),(char *)(ulong)local_24);
      piVar5 = DataArray<int>::operator[]
                         ((DataArray<int> *)
                          ((in_RDI->val).super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 0x10d),(int)pcVar3);
      *piVar5 = 0;
      uVar6 = extraout_RDX_01;
    }
    else {
      uVar6 = extraout_RDX_00;
      if (dVar2 < local_10) {
        local_1c = (int)pcVar3;
        local_10 = dVar2;
      }
    }
  }
  return local_1c;
}

Assistant:

int SPxDantzigPR<R>::selectLeaveSparse()
{
   assert(this->thesolver != nullptr);

   R best   = -this->thetolerance;
   R x;
   int  n      = -1;
   int  index;

   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      index = this->thesolver->infeasibilities.index(i);
      x = this->thesolver->fTest()[index];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            n    = index;
            best = x;
         }
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         assert(this->thesolver->isInfeasible[index] > 0);
         this->thesolver->isInfeasible[index] = 0;
      }
   }

   return n;
}